

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.c
# Opt level: O1

int16_t calc_average_fixed16(pooling_calc_context_t calc)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  byte bVar4;
  short sVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_0000001c;
  int in_stack_00000020;
  int in_stack_00000024;
  int in_stack_00000028;
  int in_stack_0000002c;
  long in_stack_00000030;
  
  if (in_stack_0000002c == 3) {
    if ((char)calc.pool_size == '\0') {
      in_stack_00000028 =
           (in_stack_0000001c - in_stack_00000018) *
           (in_stack_00000014 - in_stack_00000010) * (in_stack_0000000c - in_stack_00000008);
    }
    lVar9 = (long)in_stack_00000008;
    iVar3 = 0;
    if (in_stack_00000008 < in_stack_0000000c) {
      lVar11 = *(long *)(in_stack_00000030 + 0x18) +
               (long)in_stack_00000010 * (long)in_stack_00000024 * 2 + lVar9 * in_stack_00000020 * 2
               + (long)in_stack_00000018 * 2 + (ulong)(uint)calc.hstride * 2;
      iVar3 = 0;
      do {
        lVar8 = (long)in_stack_00000010;
        lVar10 = lVar11;
        if (in_stack_00000010 < in_stack_00000014) {
          do {
            if (in_stack_00000018 < in_stack_0000001c) {
              lVar6 = 0;
              do {
                iVar3 = iVar3 + *(short *)(lVar10 + lVar6 * 2);
                lVar6 = lVar6 + 1;
              } while ((long)in_stack_0000001c - (long)in_stack_00000018 != lVar6);
            }
            lVar8 = lVar8 + 1;
            lVar10 = lVar10 + (long)in_stack_00000024 * 2;
          } while (lVar8 != in_stack_00000014);
        }
        lVar9 = lVar9 + 1;
        lVar11 = lVar11 + (long)in_stack_00000020 * 2;
      } while (lVar9 != in_stack_0000000c);
    }
  }
  else {
    iVar3 = 0;
    if (in_stack_0000002c == 2) {
      if ((char)calc.pool_size == '\0') {
        in_stack_00000028 =
             (in_stack_00000014 - in_stack_00000010) * (in_stack_0000000c - in_stack_00000008);
      }
      lVar9 = (long)in_stack_00000008;
      iVar3 = 0;
      if (in_stack_00000008 < in_stack_0000000c) {
        iVar7 = in_stack_00000020 * in_stack_00000008 + in_stack_00000010;
        iVar3 = 0;
        do {
          if (in_stack_00000010 < in_stack_00000014) {
            lVar11 = (long)iVar7;
            do {
              iVar3 = iVar3 + *(short *)(*(long *)(in_stack_00000030 + 0x18) +
                                         (ulong)(uint)calc.hstride * 2 + lVar11 * 2);
              lVar11 = lVar11 + 1;
            } while (lVar11 < lVar9 * in_stack_00000020 + (long)in_stack_00000014);
          }
          lVar9 = lVar9 + 1;
          iVar7 = iVar7 + in_stack_00000020;
        } while (lVar9 != in_stack_0000000c);
      }
    }
  }
  sVar2 = (short)(iVar3 / in_stack_00000028);
  bVar4 = *(byte *)(in_stack_00000030 + 0x10) >> 4;
  bVar1 = *(byte *)(calc._8_8_ + 0x10) >> 4;
  if (bVar4 != bVar1) {
    iVar3 = (uint)bVar4 - (uint)bVar1;
    bVar4 = (byte)iVar3;
    if (iVar3 < 1) {
      lVar9 = (long)(int)sVar2 << (-bVar4 & 0x3f);
      sVar5 = 0;
      if (-0x80000000 < lVar9) {
        sVar5 = (short)lVar9;
      }
      sVar2 = -1;
      if (lVar9 < 0x7fffffff) {
        sVar2 = sVar5;
      }
    }
    else {
      sVar2 = (short)((int)sVar2 / (1 << (bVar4 & 0x1f)));
    }
  }
  sVar5 = -0x8000;
  if (-0x8000 < sVar2) {
    sVar5 = sVar2;
  }
  if (0x7ffe < sVar2) {
    sVar5 = 0x7fff;
  }
  return sVar5;
}

Assistant:

int16_t calc_average_fixed16(pooling_calc_context_t calc) {
  int32_t val = 0;
  int16_t average_val = 0;
  int16_t *x = (int16_t *)(calc.x->data);
  if (calc.kernel_size == 2) {
    if (!calc.including_pad) {
      calc.pool_size = (calc.hend - calc.hstart) * (calc.wend - calc.wstart);
    }
    for (int ix = calc.hstart; ix < calc.hend; ix++) {
      for (int jx = ix * calc.hstride + calc.wstart;
           jx < ix * calc.hstride + calc.wend; jx++) {
        val += *(x + jx + calc.offset_x);
      }
    }
  } else if (calc.kernel_size == 3) {
    if (!calc.including_pad) {
      calc.pool_size = (calc.hend - calc.hstart) * (calc.wend - calc.wstart) *
                       (calc.dend - calc.dstart);
    }
    for (int ix = calc.hstart; ix < calc.hend; ix++) {
      for (int jx = calc.wstart; jx < calc.wend; jx++) {
        for (int kx = calc.dstart; kx < calc.dend; kx++) {
          val +=
              *(x + ix * calc.hstride + jx * calc.wstride + kx + calc.offset_x);
        }
      }
    }
  }
  average_val = val / calc.pool_size;
  average_val =
      rescale_scalar_fixed32(average_val, calc.x->fp_pos, calc.y->fp_pos);
  average_val = saturate32_to_16(average_val);
  return average_val;
}